

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* testing::internal::
  GenerateNames<google::protobuf::(anonymous_namespace)::TypedTestName,testing::internal::Types<std::__cxx11::string,absl::lts_20250127::Cord>>
            (void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  reference pvVar2;
  reference extraout_RAX;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  *(undefined8 *)in_RDI = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  paVar1 = &local_38.field_2;
  local_38.field_2._M_allocated_capacity._0_4_ = 0x69727453;
  local_38.field_2._M_local_buf[4] = 'n';
  local_38.field_2._M_local_buf[5] = 'g';
  local_38._M_string_length = 6;
  local_38.field_2._M_local_buf[6] = '\0';
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>(in_RDI,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,
                    CONCAT17(local_38.field_2._M_local_buf[7],
                             CONCAT16(local_38.field_2._M_local_buf[6],
                                      CONCAT15(local_38.field_2._M_local_buf[5],
                                               CONCAT14(local_38.field_2._M_local_buf[4],
                                                        local_38.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_38.field_2._M_allocated_capacity._0_4_ = 0x64726f43;
  local_38._M_string_length = 4;
  local_38.field_2._M_local_buf[4] = '\0';
  local_38._M_dataplus._M_p = (pointer)paVar1;
  pvVar2 = std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
           emplace_back<std::__cxx11::string>(in_RDI,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,
                    CONCAT17(local_38.field_2._M_local_buf[7],
                             CONCAT16(local_38.field_2._M_local_buf[6],
                                      CONCAT15(local_38.field_2._M_local_buf[5],
                                               CONCAT14(local_38.field_2._M_local_buf[4],
                                                        local_38.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
    pvVar2 = extraout_RAX;
  }
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)pvVar2;
}

Assistant:

std::vector<std::string> GenerateNames() {
  std::vector<std::string> result;
  GenerateNamesRecursively<NameGenerator>(Types(), &result, 0);
  return result;
}